

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolbase.h
# Opt level: O3

void __thiscall
soplex::
LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPColBase(LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int defDim)

{
  double a;
  cpp_dec_float<200U,_int,_void> *pcVar1;
  int n;
  long in_FS_OFFSET;
  
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  (this->up).m_backend.fpclass = cpp_dec_float_finite;
  (this->up).m_backend.prec_elem = 0x1c;
  (this->up).m_backend.data._M_elems[0] = 0;
  (this->up).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[8] = 0;
  (pcVar1->data)._M_elems[9] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[10] = 0;
  (pcVar1->data)._M_elems[0xb] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0xc] = 0;
  (pcVar1->data)._M_elems[0xd] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0xe] = 0;
  (pcVar1->data)._M_elems[0xf] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x10] = 0;
  (pcVar1->data)._M_elems[0x11] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x12] = 0;
  (pcVar1->data)._M_elems[0x13] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x14] = 0;
  (pcVar1->data)._M_elems[0x15] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x16] = 0;
  (pcVar1->data)._M_elems[0x17] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x18] = 0;
  (pcVar1->data)._M_elems[0x19] = 0;
  pcVar1 = &(this->up).m_backend;
  (pcVar1->data)._M_elems[0x1a] = 0;
  (pcVar1->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->up).m_backend.data._M_elems + 0x6d) = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)this,a);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&(this->low).m_backend,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&(this->object).m_backend,0,(type *)0x0);
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->vec)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->vec).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  n = 2;
  if (0 < defDim) {
    n = defDim;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->vec,n);
  return;
}

Assistant:

explicit LPColBase(int defDim = 0)
      : up(R(infinity)), low(0), object(0), vec(defDim)
   {
      assert(isConsistent());
   }